

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall
helics::apps::Echo::Echo
          (Echo *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  Echo *in_RSI;
  char *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001a8;
  App *in_stack_000001b0;
  undefined1 in_stack_000001b8 [16];
  Echo *in_stack_00000460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [2];
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_RDI);
  this_00 = local_38;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,in_stack_ffffffffffffff98);
  App::App(in_stack_000001b0,(string_view)in_stack_000001b8,in_stack_000001a8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  *(undefined ***)in_RDI = &PTR__Echo_009be2c8;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x2330ca);
  in_RDI[0xf0] = '\0';
  in_RDI[0xf1] = '\0';
  in_RDI[0xf2] = '\0';
  in_RDI[0xf3] = '\0';
  in_RDI[0xf4] = '\0';
  in_RDI[0xf5] = '\0';
  in_RDI[0xf6] = '\0';
  in_RDI[0xf7] = '\0';
  in_RDI[0xf8] = '\0';
  in_RDI[0xf9] = '\0';
  in_RDI[0xfa] = '\0';
  in_RDI[0xfb] = '\0';
  in_RDI[0xfc] = '\0';
  in_RDI[0xfd] = '\0';
  in_RDI[0xfe] = '\0';
  in_RDI[0xff] = '\0';
  CLI::std::mutex::mutex((mutex *)0x2330f3);
  processArgs(in_stack_00000460);
  initialSetup(in_RSI);
  return;
}

Assistant:

Echo::Echo(std::vector<std::string> args): App("echo", std::move(args))
    {
        processArgs();
        initialSetup();
    }